

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FutureState.h
# Opt level: O0

void __thiscall
async_simple::FutureState<std::error_code>::ContinuationReference::detach
          (ContinuationReference *this)

{
  char cVar1;
  long lVar2;
  void *pvVar3;
  char *pcVar4;
  FutureState<std::error_code> *in_RDI;
  __int_type_conflict3 old;
  
  lVar2._0_1_ = in_RDI->_state;
  lVar2._1_1_ = in_RDI->_attached;
  lVar2._2_1_ = in_RDI->_continuationRef;
  lVar2._3_5_ = *(undefined5 *)&in_RDI->field_0x3;
  if (lVar2 != 0) {
    derefContinuation(in_RDI);
    pvVar3 = *(void **)in_RDI;
    pcVar4 = (char *)((long)pvVar3 + 1);
    LOCK();
    cVar1 = *pcVar4;
    *pcVar4 = *pcVar4 + -1;
    UNLOCK();
    if ((cVar1 == '\x01') && (pvVar3 != (void *)0x0)) {
      ~FutureState((FutureState<std::error_code> *)0x2a6c6d);
      operator_delete(pvVar3,0x60);
    }
  }
  return;
}

Assistant:

void detach() {
            if (_fs) {
                _fs->derefContinuation();
                _fs->detachOne();
            }
        }